

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O0

Iterator *
down_cast<MutableS2ShapeIndex::Iterator_const*,S2ShapeIndex::IteratorBase_const>(IteratorBase *f)

{
  bool bVar1;
  long local_28;
  IteratorBase *f_local;
  
  bVar1 = true;
  if (f != (IteratorBase *)0x0) {
    if (f == (IteratorBase *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(f,&S2ShapeIndex::IteratorBase::typeinfo,
                                &MutableS2ShapeIndex::Iterator::typeinfo,0);
    }
    bVar1 = local_28 != 0;
  }
  if (!bVar1) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/base/casts.h"
                  ,0x44,
                  "To down_cast(From *) [To = const MutableS2ShapeIndex::Iterator *, From = const S2ShapeIndex::IteratorBase]"
                 );
  }
  return (Iterator *)f;
}

Assistant:

inline To down_cast(From* f) {           // so we only accept pointers
  static_assert(
      (std::is_base_of<From, typename std::remove_pointer<To>::type>::value),
      "target type not derived from source type");

  // We skip the assert and hence the dynamic_cast if RTTI is disabled.
#if !defined(__GNUC__) || defined(__GXX_RTTI)
  // Uses RTTI in dbg and fastbuild. asserts are disabled in opt builds.
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);
#endif  // !defined(__GNUC__) || defined(__GXX_RTTI)

  return static_cast<To>(f);
}